

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

Quat * __thiscall rw::Quat::rotate(Quat *this,V3d *axis,float32 angle,CombineOp op)

{
  Quat QVar1;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined1 local_30 [8];
  Quat rot;
  CombineOp op_local;
  float32 angle_local;
  V3d *axis_local;
  Quat *this_local;
  
  rot.z = (float32)op;
  rot.w = angle;
  QVar1 = rotation(angle,axis);
  if (rot.z == 0.0) {
    local_30 = QVar1._0_8_;
    this->x = (float32)local_30._0_4_;
    this->y = (float32)local_30._4_4_;
    rot._0_8_ = QVar1._8_8_;
    this->z = rot.x;
    this->w = rot.y;
  }
  else {
    _local_30 = QVar1;
    if (rot.z == 1.4013e-45) {
      QVar1 = mult(this,(Quat *)local_30);
      local_40 = QVar1._0_8_;
      this->x = (float32)(undefined4)local_40;
      this->y = (float32)local_40._4_4_;
      local_38 = QVar1._8_8_;
      this->z = (float32)(undefined4)local_38;
      this->w = (float32)local_38._4_4_;
    }
    else if (rot.z == 2.8026e-45) {
      QVar1 = mult((Quat *)local_30,this);
      local_50 = QVar1._0_8_;
      this->x = (float32)(undefined4)local_50;
      this->y = (float32)local_50._4_4_;
      local_48 = QVar1._8_8_;
      this->z = (float32)(undefined4)local_48;
      this->w = (float32)local_48._4_4_;
    }
  }
  return this;
}

Assistant:

Quat*
Quat::rotate(const V3d *axis, float32 angle, CombineOp op)
{
	Quat rot = rotation(angle, *axis);
	switch(op){
	case COMBINEREPLACE:
		*this = rot;
		break;
	case COMBINEPRECONCAT:
		*this = mult(*this, rot);
		break;
	case COMBINEPOSTCONCAT:
		*this = mult(rot, *this);
		break;
	}
	return this;
}